

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_binder.cpp
# Opt level: O2

void __thiscall
duckdb::OrderBinder::OrderBinder
          (OrderBinder *this,vector<std::reference_wrapper<duckdb::Binder>,_true> *binders,
          SelectBindState *bind_state)

{
  pointer prVar1;
  allocator local_11;
  
  prVar1 = (binders->
           super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
           ).
           super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->binders).
  super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (binders->
       super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
       ).
       super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->binders).
  super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = prVar1;
  (this->binders).
  super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (binders->
       super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
       ).
       super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (binders->
  super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (binders->
  super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (binders->
  super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extra_list).ptr =
       (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
        *)0x0;
  this->bind_state = bind_state;
  ::std::__cxx11::string::string((string *)&this->query_component,"ORDER BY",&local_11);
  return;
}

Assistant:

OrderBinder::OrderBinder(vector<reference<Binder>> binders, SelectBindState &bind_state)
    : binders(std::move(binders)), extra_list(nullptr), bind_state(bind_state) {
}